

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall
pugi::xml_document::save_file
          (xml_document *this,wchar_t *path_,char_t *indent,uint flags,xml_encoding encoding)

{
  bool bVar1;
  FILE *data_;
  FILE *__stream;
  wchar_t *in_RDI;
  auto_deleter<_IO_FILE> file;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  int in_stack_ffffffffffffffa4;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar3;
  xml_encoding in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  char_t *in_stack_ffffffffffffffc8;
  FILE *in_stack_ffffffffffffffd0;
  xml_document *in_stack_ffffffffffffffd8;
  
  data_ = impl::anon_unknown_0::open_file_wide
                    (in_RDI,(wchar_t *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0)
                    );
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::auto_deleter
            ((auto_deleter<_IO_FILE> *)&stack0xffffffffffffffd0,data_,
             impl::anon_unknown_0::close_file);
  bVar1 = impl::anon_unknown_0::save_file_impl
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  bVar3 = false;
  if (bVar1) {
    __stream = (FILE *)impl::anon_unknown_0::auto_deleter<_IO_FILE>::release
                                 ((auto_deleter<_IO_FILE> *)&stack0xffffffffffffffd0);
    in_stack_ffffffffffffffa4 = fclose(__stream);
    bVar3 = in_stack_ffffffffffffffa4 == 0;
  }
  uVar2 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffa0);
  impl::anon_unknown_0::auto_deleter<_IO_FILE>::~auto_deleter
            ((auto_deleter<_IO_FILE> *)CONCAT44(in_stack_ffffffffffffffa4,uVar2));
  return (bool)((byte)((uint)uVar2 >> 0x18) & 1);
}

Assistant:

PUGI_IMPL_FN bool xml_document::save_file(const wchar_t* path_, const char_t* indent, unsigned int flags, xml_encoding encoding) const
	{
		using impl::auto_deleter; // MSVC7 workaround
		auto_deleter<FILE> file(impl::open_file_wide(path_, (flags & format_save_file_text) ? L"w" : L"wb"), impl::close_file);

		return impl::save_file_impl(*this, file.data, indent, flags, encoding) && fclose(file.release()) == 0;
	}